

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_event_accept.c
# Opt level: O0

ngx_int_t ngx_enable_accept_events(ngx_cycle_t *cycle)

{
  void *pvVar1;
  long lVar2;
  ngx_int_t nVar3;
  ngx_connection_t *c;
  ngx_listening_t *ls;
  ngx_uint_t i;
  ngx_cycle_t *cycle_local;
  
  pvVar1 = (cycle->listening).elts;
  ls = (ngx_listening_t *)0x0;
  while( true ) {
    if ((ngx_listening_t *)(cycle->listening).nelts <= ls) {
      return 0;
    }
    lVar2 = *(long *)((long)pvVar1 + (long)ls * 0xe0 + 200);
    if (((lVar2 != 0) && ((*(uint *)(*(long *)(lVar2 + 8) + 8) >> 3 & 1) == 0)) &&
       (nVar3 = (*ngx_event_actions.add)(*(ngx_event_t **)(lVar2 + 8),1,0), nVar3 == -1)) break;
    ls = (ngx_listening_t *)((long)&ls->fd + 1);
  }
  return -1;
}

Assistant:

static ngx_int_t
ngx_enable_accept_events(ngx_cycle_t *cycle)
{
    ngx_uint_t         i;
    ngx_listening_t   *ls;
    ngx_connection_t  *c;

    ls = cycle->listening.elts;
    for (i = 0; i < cycle->listening.nelts; i++) {

        c = ls[i].connection;

        if (c == NULL || c->read->active) {
            continue;
        }

        if (ngx_add_event(c->read, NGX_READ_EVENT, 0) == NGX_ERROR) {
            return NGX_ERROR;
        }
    }

    return NGX_OK;
}